

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O1

CREDENTIAL_RESULT *
iothub_device_auth_generate_credentials
          (IOTHUB_SECURITY_HANDLE handle,DEVICE_AUTH_CREDENTIAL_INFO *dev_auth_cred)

{
  char **destination;
  char cVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  STRING_HANDLE input;
  STRING_HANDLE handle_00;
  STRING_HANDLE handle_01;
  char *pcVar6;
  char *pcVar7;
  STRING_HANDLE handle_02;
  CREDENTIAL_RESULT *pCVar8;
  char *pcVar9;
  uchar *data_value;
  size_t data_len;
  char expire_token [64];
  char *local_a0;
  uchar *local_88;
  size_t local_80;
  char local_78 [72];
  
  if (handle == (IOTHUB_SECURITY_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar9 = "Invalid handle parameter: handle";
    iVar2 = 0x114;
LAB_0014530c:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
              ,"iothub_device_auth_generate_credentials",iVar2,1,pcVar9);
    return (CREDENTIAL_RESULT *)0x0;
  }
  if ((handle->cred_type | AUTH_TYPE_X509) != AUTH_TYPE_SYMM_KEY) {
    if (handle->x509_certificate != (char *)0x0) {
      free(handle->x509_certificate);
      handle->x509_certificate = (char *)0x0;
    }
    if (handle->x509_alias_key != (char *)0x0) {
      free(handle->x509_alias_key);
      handle->x509_alias_key = (char *)0x0;
    }
    pCVar8 = (CREDENTIAL_RESULT *)malloc(0x18);
    if (pCVar8 != (CREDENTIAL_RESULT *)0x0) {
      pcVar9 = (*handle->hsm_client_get_cert)(handle->hsm_client_handle);
      handle->x509_certificate = pcVar9;
      if (pcVar9 == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                    ,"iothub_device_auth_generate_credentials",0x1b7,1,
                    "Failure allocating device credential result.");
        }
      }
      else {
        pcVar9 = (*handle->hsm_client_get_alias_key)(handle->hsm_client_handle);
        handle->x509_alias_key = pcVar9;
        if (pcVar9 != (char *)0x0) {
          (pCVar8->auth_cred_result).sas_result.sas_token = handle->x509_certificate;
          (pCVar8->auth_cred_result).x509_result.x509_alias_key = pcVar9;
          return pCVar8;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                    ,"iothub_device_auth_generate_credentials",0x1bd,1,
                    "Failure allocating device credential result.");
        }
        free(handle->x509_certificate);
        handle->x509_certificate = (char *)0x0;
      }
      free(pCVar8);
      return (CREDENTIAL_RESULT *)0x0;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar9 = "Failure allocating credential result.";
    iVar2 = 0x1b3;
    goto LAB_0014530c;
  }
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  destination = &handle->sas_token;
  if (handle->sas_token != (char *)0x0) {
    free(handle->sas_token);
    *destination = (char *)0x0;
  }
  if ((dev_auth_cred == (DEVICE_AUTH_CREDENTIAL_INFO *)0x0) ||
     ((dev_auth_cred->sas_info).token_scope == (char *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar9 = "Invalid handle parameter: dev_auth_cred";
    iVar2 = 0x123;
    goto LAB_0014530c;
  }
  if ((dev_auth_cred->dev_auth_type | AUTH_TYPE_X509) != AUTH_TYPE_SYMM_KEY) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar9 = "Invalid handle parameter: dev_auth_cred.dev_auth_type";
    iVar2 = 0x128;
    goto LAB_0014530c;
  }
  iVar2 = size_tToString(local_78,0x40,(dev_auth_cred->sas_info).expiry_seconds);
  if (iVar2 != 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar9 = "Failure creating expire token";
    iVar2 = 0x12e;
    goto LAB_0014530c;
  }
  pcVar9 = (dev_auth_cred->sas_info).token_scope;
  sVar4 = strlen(pcVar9);
  sVar5 = strlen(local_78);
  __s = (char *)malloc(sVar4 + sVar5 + 4);
  if (__s == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar9 = "Failure allocating payload.";
    iVar2 = 0x137;
    goto LAB_0014530c;
  }
  iVar2 = sprintf(__s,"%s\n%s",pcVar9,local_78);
  if (iVar2 == 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_00145365:
      pCVar8 = (CREDENTIAL_RESULT *)0x0;
      goto LAB_00145668;
    }
    pcVar9 = "Failure constructing hash payload.";
    iVar2 = 0x142;
  }
  else {
    iVar2 = sign_sas_data(handle,__s,&local_88,&local_80);
    if (iVar2 == 0) {
      if (handle->base64_encode_signature == true) {
        input = Azure_Base64_Encode_Bytes(local_88,local_80);
      }
      else {
        input = STRING_construct((char *)local_88);
      }
      if (input == (STRING_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0014544d;
        pCVar8 = (CREDENTIAL_RESULT *)0x0;
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                  ,"iothub_device_auth_generate_credentials",0x154,1,
                  "Failure constructing encoding.");
      }
      else {
        handle_00 = URL_Encode(input);
        if (handle_00 == (STRING_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                      ,"iothub_device_auth_generate_credentials",0x159,1,
                      "Failure constructing url Signature.");
          }
          STRING_delete(input);
LAB_0014544d:
          pCVar8 = (CREDENTIAL_RESULT *)0x0;
        }
        else {
          pcVar9 = (dev_auth_cred->sas_info).key_name;
          if (pcVar9 == (char *)0x0) {
            pcVar9 = "";
            local_a0 = "";
          }
          else {
            cVar1 = *pcVar9;
            if (cVar1 == '\0') {
              pcVar9 = "";
            }
            local_a0 = "&skn=";
            if (cVar1 == '\0') {
              local_a0 = "";
            }
          }
          pcVar6 = (dev_auth_cred->sas_info).token_scope;
          if (handle->urlencode_token_scope == true) {
            handle_01 = URL_EncodeString(pcVar6);
            if (handle_01 == (STRING_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) {
                handle_02 = (STRING_HANDLE)0x0;
              }
              else {
                handle_02 = (STRING_HANDLE)0x0;
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                          ,"iothub_device_auth_generate_credentials",0x16f,1,
                          "failed to url string %s",(dev_auth_cred->sas_info).token_scope);
              }
            }
            else {
              pcVar6 = STRING_c_str(handle_01);
              pcVar7 = STRING_c_str(handle_00);
              handle_02 = STRING_construct_sprintf
                                    ("SharedAccessSignature sr=%s&sig=%s&se=%s%s%s",pcVar6,pcVar7,
                                     local_78,local_a0,pcVar9);
            }
            STRING_delete(handle_01);
          }
          else {
            pcVar7 = STRING_c_str(handle_00);
            handle_02 = STRING_construct_sprintf
                                  ("SharedAccessSignature sr=%s&sig=%s&se=%s%s%s",pcVar6,pcVar7,
                                   local_78,local_a0,pcVar9);
          }
          if (handle_02 == (STRING_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar9 = "Failure constructing url Signature.";
              iVar2 = 0x180;
              goto LAB_00145625;
            }
LAB_00145632:
            pCVar8 = (CREDENTIAL_RESULT *)0x0;
          }
          else {
            pCVar8 = (CREDENTIAL_RESULT *)malloc(0x18);
            if (pCVar8 == (CREDENTIAL_RESULT *)0x0) {
              STRING_delete(handle_02);
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00145632;
              pcVar9 = "Failure allocating credential result.";
              iVar2 = 0x185;
LAB_00145625:
              pCVar8 = (CREDENTIAL_RESULT *)0x0;
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                        ,"iothub_device_auth_generate_credentials",iVar2,1,pcVar9);
            }
            else {
              pcVar9 = STRING_c_str(handle_02);
              iVar2 = mallocAndStrcpy_s(destination,pcVar9);
              if (iVar2 == 0) {
                (pCVar8->auth_cred_result).x509_result.x509_cert = *destination;
              }
              else {
                free(pCVar8);
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  pCVar8 = (CREDENTIAL_RESULT *)0x0;
                }
                else {
                  pCVar8 = (CREDENTIAL_RESULT *)0x0;
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                            ,"iothub_device_auth_generate_credentials",0x18e,1,
                            "Failure allocating and copying string.");
                }
              }
              STRING_delete(handle_02);
            }
          }
          STRING_delete(input);
          STRING_delete(handle_00);
        }
      }
      free(local_88);
      goto LAB_00145668;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00145365;
    pcVar9 = "Failure generate hash from tpm.";
    iVar2 = 0x19e;
  }
  pCVar8 = (CREDENTIAL_RESULT *)0x0;
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
            ,"iothub_device_auth_generate_credentials",iVar2,1,pcVar9);
LAB_00145668:
  free(__s);
  return pCVar8;
}

Assistant:

CREDENTIAL_RESULT* iothub_device_auth_generate_credentials(IOTHUB_SECURITY_HANDLE handle, const DEVICE_AUTH_CREDENTIAL_INFO* dev_auth_cred)
{
    CREDENTIAL_RESULT* result;
    if (handle == NULL)
    {
        LogError("Invalid handle parameter: handle");
        result = NULL;
    }
    else
    {
        if (handle->cred_type == AUTH_TYPE_SAS || handle->cred_type == AUTH_TYPE_SYMM_KEY)
        {
            char expire_token[64] = { 0 };
            if (handle->sas_token != NULL)
            {
                free(handle->sas_token);
                handle->sas_token = NULL;
            }
            if (dev_auth_cred == NULL || dev_auth_cred->sas_info.token_scope == NULL)
            {
                LogError("Invalid handle parameter: dev_auth_cred");
                result = NULL;
            }
            else if (dev_auth_cred->dev_auth_type != AUTH_TYPE_SAS && dev_auth_cred->dev_auth_type != AUTH_TYPE_SYMM_KEY)
            {
                LogError("Invalid handle parameter: dev_auth_cred.dev_auth_type");
                result = NULL;
            }
            else if (size_tToString(expire_token, sizeof(expire_token), (size_t)dev_auth_cred->sas_info.expiry_seconds) != 0)
            {
                result = NULL;
                LogError("Failure creating expire token");
            }
            else
            {
                size_t len = strlen(dev_auth_cred->sas_info.token_scope)+strlen(expire_token)+3;
                char* payload = malloc(len+1);
                if (payload == NULL)
                {
                    result = NULL;
                    LogError("Failure allocating payload.");
                }
                else
                {
                    unsigned char* data_value;
                    size_t data_len;

                    size_t total_len = sprintf(payload, "%s\n%s", dev_auth_cred->sas_info.token_scope, expire_token);
                    if (total_len <= 0)
                    {
                        result = NULL;
                        LogError("Failure constructing hash payload.");
                    }
                    else if (sign_sas_data(handle, payload, &data_value, &data_len) == 0)
                    {
                        STRING_HANDLE urlEncodedSignature = NULL;
                        STRING_HANDLE signature = NULL;
                        if (handle->base64_encode_signature == true)
                        {
                            signature = Azure_Base64_Encode_Bytes(data_value, data_len);
                        }
                        else
                        {
                            signature = STRING_construct((const char*)data_value);
                        }

                        if (signature == NULL)
                        {
                            result = NULL;
                            LogError("Failure constructing encoding.");
                        }
                        else if ((urlEncodedSignature = URL_Encode(signature)) == NULL)
                        {
                            result = NULL;
                            LogError("Failure constructing url Signature.");
                            STRING_delete(signature);
                        }
                        else
                        {
                            const char* skn_key = "";
                            const char* skn_value = "";

                            if ((dev_auth_cred->sas_info.key_name != NULL) && (strlen(dev_auth_cred->sas_info.key_name) > 0))
                            {
                                // If the key name is valid then add to the sas token
                                skn_key = SKN_SECTION_FORMAT;
                                skn_value = dev_auth_cred->sas_info.key_name;
                            }

                            STRING_HANDLE sas_token_handle = NULL;

                            if (handle->urlencode_token_scope == true)
                            {
                                STRING_HANDLE url_encoded = URL_EncodeString(dev_auth_cred->sas_info.token_scope);
                                if (url_encoded == NULL)
                                {
                                    LogError("failed to url string %s", dev_auth_cred->sas_info.token_scope);
                                }
                                else
                                {
                                    sas_token_handle = STRING_construct_sprintf(SAS_TOKEN_FORMAT, STRING_c_str(url_encoded), STRING_c_str(urlEncodedSignature), expire_token, skn_key, skn_value);
                                }

                                STRING_delete(url_encoded);
                            }
                            else
                            {
                                sas_token_handle = STRING_construct_sprintf(SAS_TOKEN_FORMAT, dev_auth_cred->sas_info.token_scope, STRING_c_str(urlEncodedSignature), expire_token, skn_key, skn_value);
                            }

                            if (sas_token_handle == NULL)
                            {
                                result = NULL;
                                LogError("Failure constructing url Signature.");
                            }
                            else if ((result = malloc(sizeof(CREDENTIAL_RESULT))) == NULL)
                            {
                                STRING_delete(sas_token_handle);
                                LogError("Failure allocating credential result.");
                            }
                            else
                            {
                                const char* temp_sas_token = STRING_c_str(sas_token_handle);
                                if (mallocAndStrcpy_s(&handle->sas_token, temp_sas_token) != 0)
                                {
                                    free(result);
                                    result = NULL;
                                    LogError("Failure allocating and copying string.");
                                }
                                else
                                {
                                    result->auth_cred_result.sas_result.sas_token = handle->sas_token;
                                }
                                STRING_delete(sas_token_handle);
                            }
                            STRING_delete(signature);
                            STRING_delete(urlEncodedSignature);
                        }
                        free(data_value);
                    }
                    else
                    {
                        result = NULL;
                        LogError("Failure generate hash from tpm.");
                    }
                    free(payload);
                }
            }
        }
        else
        {
            if (handle->x509_certificate != NULL)
            {
                free(handle->x509_certificate);
                handle->x509_certificate = NULL;
            }
            if (handle->x509_alias_key != NULL)
            {
                free(handle->x509_alias_key);
                handle->x509_alias_key = NULL;
            }

            if ((result = malloc(sizeof(CREDENTIAL_RESULT))) == NULL)
            {
                LogError("Failure allocating credential result.");
            }
            else if ((handle->x509_certificate = handle->hsm_client_get_cert(handle->hsm_client_handle)) == NULL)
            {
                LogError("Failure allocating device credential result.");
                free(result);
                result = NULL;
            }
            else if ((handle->x509_alias_key = handle->hsm_client_get_alias_key(handle->hsm_client_handle)) == NULL)
            {
                LogError("Failure allocating device credential result.");
                free(handle->x509_certificate);
                handle->x509_certificate = NULL;
                free(result);
                result = NULL;
            }
            else
            {
                result->auth_cred_result.x509_result.x509_cert = handle->x509_certificate;
                result->auth_cred_result.x509_result.x509_alias_key = handle->x509_alias_key;
            }
        }
    }
    return result;
}